

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

void __thiscall icu_63::Calendar::setRelatedYear(Calendar *this,int32_t year)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  int i;
  long lVar4;
  char **ppcVar5;
  bool bVar6;
  
  iVar1 = (*(this->super_UObject)._vptr_UObject[0x17])();
  ppcVar5 = gCalTypes;
  lVar4 = 0;
  do {
    iVar2 = uprv_stricmp_63((char *)CONCAT44(extraout_var,iVar1),*ppcVar5);
    if (iVar2 == 0) goto LAB_001e6f17;
    lVar4 = lVar4 + 1;
    ppcVar5 = ppcVar5 + 1;
  } while (lVar4 != 0x12);
  lVar4 = 0xffffffff;
LAB_001e6f17:
  switch((int)lVar4) {
  case 4:
    year = year + -0x26e;
    break;
  case 5:
  case 6:
  case 0xf:
  case 0x10:
  case 0x11:
    if (year < 0x7b9) {
      uVar3 = ((year + -0x7b8) / 0x41) * 2 - 2;
      bVar6 = (0x7b8U - year) % 0x41 < 0x21;
    }
    else {
      uVar3 = ((year - 0x7b9U) / 0x41) * 2;
      bVar6 = 0x1f < (year - 0x7b9U) % 0x41;
    }
    year = year + (bVar6 | uVar3) + -0x243;
    break;
  case 7:
    year = year + 0xeb0;
    break;
  case 8:
    year = year + 0xa4d;
    break;
  case 9:
    year = year + -0x4f;
    break;
  case 10:
    year = year + -0x11c;
    break;
  case 0xb:
    year = year + -8;
    break;
  case 0xc:
    year = year + 0x1574;
    break;
  case 0xe:
    year = year + 0x91d;
  }
  set(this,UCAL_EXTENDED_YEAR,year);
  return;
}

Assistant:

void Calendar::setRelatedYear(int32_t year)
{
    // modify for calendar type
    ECalType type = getCalendarType(getType());
    switch (type) {
        case CALTYPE_PERSIAN:
            year -= 622; break;
        case CALTYPE_HEBREW:
            year += 3760; break;
        case CALTYPE_CHINESE:
            year += 2637; break;
        case CALTYPE_INDIAN:
            year -= 79; break;
        case CALTYPE_COPTIC:
            year -= 284; break;
        case CALTYPE_ETHIOPIC:
            year -= 8; break;
        case CALTYPE_ETHIOPIC_AMETE_ALEM:
            year +=5492; break;
        case CALTYPE_DANGI:
            year += 2333; break;
        case CALTYPE_ISLAMIC_CIVIL:
        case CALTYPE_ISLAMIC:
        case CALTYPE_ISLAMIC_UMALQURA:
        case CALTYPE_ISLAMIC_TBLA:
        case CALTYPE_ISLAMIC_RGSA:
            year = firstIslamicStartYearFromGrego(year); break;
        default:
            // CALTYPE_GREGORIAN
            // CALTYPE_JAPANESE
            // CALTYPE_BUDDHIST
            // CALTYPE_ROC
            // CALTYPE_ISO8601
            // do nothing, EXTENDED_YEAR same as Gregorian
            break;
    }
    // set extended year
    set(UCAL_EXTENDED_YEAR, year);
}